

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_match_utxo_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_KnapsackSolver_match_utxo_with_asset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type_conflict *pmVar8;
  char *in_R9;
  Amount AVar9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap *in_stack_00000348;
  Amount *in_stack_00000350;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_00000358;
  AmountMap *in_stack_00000360;
  AmountMap map_target_amount;
  CoinSelectionOption option;
  ConfidentialAssetId *in_stack_fffffffffffffbe8;
  CoinSelectionOption *in_stack_fffffffffffffbf0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbf8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_fffffffffffffc30;
  string local_358;
  AssertHelper local_338;
  Message local_330;
  string local_328;
  byte local_301;
  AssertionResult local_300;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined4 local_2dc;
  size_type local_2d8;
  AssertionResult local_2d0;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined4 local_2ac;
  int64_t local_2a8;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  string local_278;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  size_type local_230;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined8 local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  size_type local_1d8;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8 [8];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_178;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_160 [2];
  _func_int **local_130;
  undefined1 local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [64];
  string local_d0 [3];
  char local_70 [112];
  
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x26d437);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_d0,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](in_stack_fffffffffffffc30,
                        (key_type *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
  *pmVar3 = 0x253ff00;
  std::__cxx11::string::~string((string *)local_d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x26d495);
  cfd::core::Amount::Amount((Amount *)local_110);
  AVar9 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_130 = (_func_int **)AVar9.amount_;
  local_128 = AVar9.ignore_check_;
  local_120._0_8_ = local_130;
  local_120[8] = local_128;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x26d508);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x26d515);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetElementsUtxoList();
      in_stack_fffffffffffffc00 = local_160;
      in_stack_fffffffffffffbf8 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_110;
      in_stack_fffffffffffffbf0 = (CoinSelectionOption *)(local_110 + 0x10);
      in_stack_fffffffffffffbe8 = (ConfidentialAssetId *)local_120;
      in_stack_fffffffffffffc08 = (char *)0x0;
      in_R9 = local_70;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)
                 map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (AmountMap *)map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                 (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                 map_select_value._M_t._M_impl._0_8_,(UtxoFilter *)fee._8_8_,
                 (CoinSelectionOption *)fee.amount_,
                 (Amount *)map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 in_stack_00000348,in_stack_00000350,in_stack_00000358,in_stack_00000360);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc00);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc00);
    }
  }
  else {
    testing::Message::Message(local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x392,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message((Message *)0x26d755);
  }
  local_1d8 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_178);
  local_1dc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (unsigned_long *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26d84a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x394,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x26d8ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26d905);
  sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_178);
  if (sVar5 == 1) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_178,0);
    local_208 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
               (unsigned_long *)in_stack_fffffffffffffbf8,(long *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26d9d4);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x396,pcVar4);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x26da37);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26da8c);
  }
  local_230 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x26daad);
  local_234 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (unsigned_long *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26db4a);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x398,pcVar4);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message((Message *)0x26dba7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26dbff);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x26dc0c);
  if (sVar6 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_278,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[](in_stack_fffffffffffffc30,
                 (key_type *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    local_27c = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
               (long *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string((string *)&local_278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26dd19);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x39a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message((Message *)0x26dd76);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26ddcb);
  }
  local_2a8 = cfd::core::Amount::GetSatoshiValue((Amount *)local_110);
  local_2ac = 0x708;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (long *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    in_stack_fffffffffffffc30 =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x26de8f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x39c,(char *)in_stack_fffffffffffffc30);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message((Message *)0x26deec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26df41);
  local_2d8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x26df4e);
  local_2dc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (unsigned_long *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_2e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26dff7);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x39d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message((Message *)0x26e054);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26e0ac);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x26e0b9);
  if (sVar7 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_328,&exp_dummy_asset_a);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)in_stack_fffffffffffffc30,
                          (key_type *)CONCAT17(uVar2,in_stack_fffffffffffffc28));
    local_301 = ~*pmVar8 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8,
               (type *)0x26e120);
    std::__cxx11::string::~string((string *)&local_328);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_358,(internal *)&local_300,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x39f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      testing::Message::~Message((Message *)0x26e24b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26e2c3);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x26e2ee);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x26e2fb);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x26e308);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x26e315);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_match_utxo_with_asset)
{
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  // 39062500 - 1800 - 1500
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 39059200;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 1);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(39062500));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 39062500);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}